

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
          (QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *b,qsizetype n)

{
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar1;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar2;
  long lVar3;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar4;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *end;
  
  ppVar4 = b + n;
  ppVar2 = (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).ptr
  ;
  lVar3 = (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).size
  ;
  ppVar1 = ppVar2 + lVar3;
  if (ppVar4 == ppVar1 || ppVar2 != b) {
    if (ppVar4 != ppVar1) {
      do {
        QHttpNetworkRequest::operator=(&b->first,&b[n].first);
        ppVar4 = b + n + 1;
        b->second = b[n].second;
        b = b + 1;
      } while (ppVar4 != ppVar1);
      lVar3 = (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).
              size;
      ppVar4 = ppVar1;
    }
  }
  else {
    (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).ptr =
         ppVar4;
  }
  (this->super_QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>).size =
       lVar3 - n;
  for (; b != ppVar4; b = b + 1) {
    QHttpNetworkRequest::~QHttpNetworkRequest(&b->first);
  }
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }